

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int det_4d_filter(double *p0,double *p1,double *p2,double *p3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar8 = *p0;
  dVar10 = p0[1];
  dVar1 = *p1;
  dVar2 = p1[1];
  dVar11 = *p2;
  dVar3 = p2[1];
  dVar12 = *p3;
  dVar20 = p3[1];
  dVar4 = p0[2];
  dVar5 = p1[2];
  dVar6 = p2[2];
  dVar9 = ABS(dVar1);
  if (ABS(dVar1) <= ABS(dVar8)) {
    dVar9 = ABS(dVar8);
  }
  dVar15 = ABS(dVar11);
  if (ABS(dVar11) <= dVar9) {
    dVar15 = dVar9;
  }
  dVar9 = ABS(dVar12);
  if (ABS(dVar12) <= dVar15) {
    dVar9 = dVar15;
  }
  dVar15 = ABS(dVar2);
  if (ABS(dVar2) <= ABS(dVar10)) {
    dVar15 = ABS(dVar10);
  }
  dVar13 = ABS(dVar3);
  if (ABS(dVar3) <= dVar15) {
    dVar13 = dVar15;
  }
  dVar15 = ABS(dVar20);
  if (ABS(dVar20) <= dVar13) {
    dVar15 = dVar13;
  }
  dVar13 = ABS(dVar5);
  if (ABS(dVar5) <= ABS(dVar4)) {
    dVar13 = ABS(dVar4);
  }
  dVar16 = ABS(dVar6);
  if (ABS(dVar6) <= dVar13) {
    dVar16 = dVar13;
  }
  dVar13 = p3[2];
  dVar19 = ABS(dVar13);
  if (ABS(dVar13) <= dVar16) {
    dVar19 = dVar16;
  }
  dVar14 = ABS(p0[3]);
  dVar16 = ABS(p1[3]);
  if (dVar16 <= dVar14) {
    dVar16 = dVar14;
  }
  dVar14 = ABS(p2[3]);
  if (dVar14 <= dVar16) {
    dVar14 = dVar16;
  }
  dVar16 = ABS(p3[3]);
  dVar18 = dVar15;
  dVar17 = dVar9;
  if ((dVar9 <= dVar15) && (dVar18 = dVar9, dVar9 < dVar15)) {
    dVar17 = dVar15;
  }
  if (dVar16 <= dVar14) {
    dVar16 = dVar14;
  }
  dVar14 = dVar19;
  if ((dVar18 <= dVar19) && (dVar14 = dVar18, dVar17 < dVar19)) {
    dVar17 = dVar19;
  }
  dVar18 = dVar16;
  if ((dVar14 <= dVar16) && (dVar18 = dVar14, dVar17 < dVar16)) {
    dVar17 = dVar16;
  }
  iVar7 = 0;
  if ((3.2040245907439903e-74 <= dVar18) && (iVar7 = 0, dVar17 <= 1.447401115466452e+76)) {
    dVar18 = dVar12 * dVar10 - dVar20 * dVar8;
    dVar14 = dVar12 * dVar2 - dVar20 * dVar1;
    dVar20 = dVar12 * dVar3 - dVar20 * dVar11;
    dVar12 = dVar11 * dVar10 - dVar3 * dVar8;
    dVar11 = dVar11 * dVar2 - dVar3 * dVar1;
    dVar8 = dVar1 * dVar10 - dVar2 * dVar8;
    dVar10 = dVar9 * dVar15 * dVar19 * dVar16 * 2.111354066053168e-14;
    dVar8 = ((dVar13 * dVar8 + (dVar14 * dVar4 - dVar18 * dVar5)) * p2[3] +
            ((dVar11 * dVar13 + (dVar20 * dVar5 - dVar6 * dVar14)) * p0[3] -
            p1[3] * (dVar12 * dVar13 + (dVar20 * dVar4 - dVar6 * dVar18)))) -
            (dVar8 * dVar6 + (dVar11 * dVar4 - dVar5 * dVar12)) * p3[3];
    iVar7 = 1;
    if ((dVar8 <= dVar10) && (iVar7 = 0, dVar8 < -dVar10)) {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

inline int det_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3) {
    double m12;
    m12 = ((p1[0] * p0[1]) - (p0[0] * p1[1]));
    double m13;
    m13 = ((p2[0] * p0[1]) - (p0[0] * p2[1]));
    double m14;
    m14 = ((p3[0] * p0[1]) - (p0[0] * p3[1]));
    double m23;
    m23 = ((p2[0] * p1[1]) - (p1[0] * p2[1]));
    double m24;
    m24 = ((p3[0] * p1[1]) - (p1[0] * p3[1]));
    double m34;
    m34 = ((p3[0] * p2[1]) - (p2[0] * p3[1]));
    double m123;
    m123 = (((m23 * p0[2]) - (m13 * p1[2])) + (m12 * p2[2]));
    double m124;
    m124 = (((m24 * p0[2]) - (m14 * p1[2])) + (m12 * p3[2]));
    double m134;
    m134 = (((m34 * p0[2]) - (m14 * p2[2])) + (m13 * p3[2]));
    double m234;
    m234 = (((m34 * p1[2]) - (m24 * p2[2])) + (m23 * p3[2]));
    double Delta;
    Delta = ((((m234 * p0[3]) - (m134 * p1[3])) + (m124 * p2[3])) - (m123 * p3[3]));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0[0]);
    if( (max1 < fabs(p1[0])) )
    {
        max1 = fabs(p1[0]);
    } 
    if( (max1 < fabs(p2[0])) )
    {
        max1 = fabs(p2[0]);
    } 
    if( (max1 < fabs(p3[0])) )
    {
        max1 = fabs(p3[0]);
    } 
    double max2 = fabs(p0[1]);
    if( (max2 < fabs(p1[1])) )
    {
        max2 = fabs(p1[1]);
    } 
    if( (max2 < fabs(p2[1])) )
    {
        max2 = fabs(p2[1]);
    } 
    if( (max2 < fabs(p3[1])) )
    {
        max2 = fabs(p3[1]);
    } 
    double max3 = fabs(p0[2]);
    if( (max3 < fabs(p1[2])) )
    {
        max3 = fabs(p1[2]);
    } 
    if( (max3 < fabs(p2[2])) )
    {
        max3 = fabs(p2[2]);
    } 
    if( (max3 < fabs(p3[2])) )
    {
        max3 = fabs(p3[2]);
    } 
    double max4 = fabs(p0[3]);
    if( (max4 < fabs(p1[3])) )
    {
        max4 = fabs(p1[3]);
    } 
    if( (max4 < fabs(p2[3])) )
    {
        max4 = fabs(p2[3]);
    } 
    if( (max4 < fabs(p3[3])) )
    {
        max4 = fabs(p3[3]);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (lower_bound_1 < 3.20402459074399025456e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.44740111546645196071e+76) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.11135406605316806158e-14 * (((max1 * max2) * max3) * max4));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}